

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::ModelDescription::set_predictedfeaturename
          (ModelDescription *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  undefined1 local_50 [56];
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/../build/format/Model.pb.h"
               ,0xba7);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  std::__cxx11::string::string((string *)local_50,value,(allocator *)&local_51);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

inline void ModelDescription::set_predictedfeaturename(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  predictedfeaturename_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.ModelDescription.predictedFeatureName)
}